

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_OperatorEquals_Test
          (HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  pointer __ptr;
  
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c19538;
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c195f8;
  __ptr = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.table;
  if (__ptr != (pointer)0x0) {
    free(__ptr);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}